

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalCTE,std::__cxx11::string&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,unsigned_long&>
          (PhysicalPlan *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_long *args_1,vector<duckdb::LogicalType,_true> *args_2,PhysicalOperator *args_3,
          PhysicalOperator *args_4,unsigned_long *args_5)

{
  pointer *pprVar1;
  pointer pcVar2;
  idx_t table_index;
  iterator __position;
  PhysicalCTE *this_00;
  reference_wrapper<duckdb::PhysicalOperator> local_78;
  PhysicalOperator *local_70;
  string local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_70 = args_4;
  this_00 = (PhysicalCTE *)ArenaAllocator::AllocateAligned(&this->arena,0xd0);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar2 = (args->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + args->_M_string_length);
  table_index = *args_1;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &args_2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  PhysicalCTE::PhysicalCTE
            (this_00,&local_68,table_index,(vector<duckdb::LogicalType,_true> *)&local_48,args_3,
             local_70,*args_5);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_78._M_data = (PhysicalOperator *)this_00;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,&local_78);
  }
  else {
    (__position._M_current)->_M_data = (PhysicalOperator *)this_00;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}